

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::adjust_precision(int *precision,int exp10)

{
  int iVar1;
  int iVar2;
  char *message;
  format_error local_28;
  int local_14;
  int *piStack_10;
  int exp10_local;
  int *precision_local;
  
  local_14 = exp10;
  piStack_10 = precision;
  if (0 < exp10) {
    iVar1 = *precision;
    iVar2 = max_value<int>();
    if (iVar2 - local_14 < iVar1) {
      format_error::runtime_error(&local_28,"number is too big");
      message = (char *)std::runtime_error::what();
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/fmt/include/fmt/format.h"
                  ,0xad9,message);
      format_error::~format_error(&local_28);
    }
  }
  *piStack_10 = local_14 + *piStack_10;
  return;
}

Assistant:

inline FMT_CONSTEXPR20 void adjust_precision(int& precision, int exp10) {
  // Adjust fixed precision by exponent because it is relative to decimal
  // point.
  if (exp10 > 0 && precision > max_value<int>() - exp10)
    FMT_THROW(format_error("number is too big"));
  precision += exp10;
}